

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::get_object_handle(void *ptr,type_info *type)

{
  PyTypeObject *t;
  long *plVar1;
  internals *piVar2;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var3;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var4;
  long lVar5;
  ulong uVar6;
  type_info *ptVar7;
  ulong uVar8;
  PyTypeObject *unaff_R14;
  bool bVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar10;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar11;
  void *local_38;
  
  local_38 = ptr;
  piVar2 = get_internals();
  pVar10 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(piVar2->registered_instances)._M_h,&local_38);
  _Var3._M_cur = (__node_type *)
                 pVar10.first.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                 ._M_cur;
  do {
    if ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
        _Var3._M_cur ==
        pVar10.second.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
       ) {
      return (handle)(PyObject *)0x0;
    }
    t = *(PyTypeObject **)
         (*(long *)((long)&((_Var3._M_cur)->
                           super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                           ._M_storage._M_storage + 8) + 8);
    pVar11 = all_type_info_get_cache(unaff_R14);
    _Var4 = pVar11.first.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      all_type_info_populate
                (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    *)((long)_Var4.
                             super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                             ._M_cur + 0x10));
    }
    plVar1 = *(long **)((long)_Var4.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur + 0x10);
    if (plVar1 == *(long **)((long)_Var4.
                                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                   ._M_cur + 0x18)) {
      ptVar7 = (type_info *)0x0;
    }
    else {
      ptVar7 = (type_info *)*plVar1;
    }
    lVar5 = (long)*(long **)((long)_Var4.
                                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                   ._M_cur + 0x18) - (long)plVar1;
    if (lVar5 != 0) {
      uVar6 = lVar5 >> 3;
      uVar8 = 1;
      do {
        if (ptVar7 == type) {
          return (handle)*(PyObject **)
                          ((long)&((_Var3._M_cur)->
                                  super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                                  ._M_storage._M_storage + 8);
        }
        if (uVar8 < uVar6) {
          ptVar7 = (type_info *)plVar1[uVar8];
        }
        else {
          ptVar7 = (type_info *)0x0;
        }
        bVar9 = uVar8 != uVar6;
        uVar8 = uVar8 + 1;
      } while (bVar9);
    }
    _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt;
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline handle get_object_handle(const void *ptr, const detail::type_info *type ) {
    auto &instances = get_internals().registered_instances;
    auto range = instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        for (auto vh : values_and_holders(it->second)) {
            if (vh.type == type)
                return handle((PyObject *) it->second);
        }
    }
    return handle();
}